

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall cmFileCopier::CheckValue(cmFileCopier *this,string *arg)

{
  cmCommand *pcVar1;
  bool bVar2;
  ulong uVar3;
  string *psVar4;
  reference pMVar5;
  ostream *poVar6;
  string local_408;
  ostringstream local_3e8 [8];
  ostringstream e_1;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_270;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_268;
  string local_260;
  undefined1 local_240 [8];
  ostringstream e;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_c8;
  __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
  local_c0;
  string local_b8;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string regex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *arg_local;
  cmFileCopier *this_local;
  
  local_20 = arg;
  arg_local = (string *)this;
  switch(this->Doing) {
  case 2:
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) || (bVar2 = cmsys::SystemTools::FileIsFullPath(local_20), bVar2)) {
      std::__cxx11::string::operator=((string *)&this->Destination,(string *)local_20);
    }
    else {
      psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::operator=((string *)&this->Destination,(string *)psVar4);
      std::operator+(&local_40,"/",local_20);
      std::__cxx11::string::operator+=((string *)&this->Destination,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    this->Doing = 0;
    break;
  case 3:
    bVar2 = cmsys::SystemTools::FileIsFullPath(arg);
    if (bVar2) {
      std::__cxx11::string::operator=((string *)&this->FilesFromDir,(string *)local_20);
    }
    else {
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::operator=((string *)&this->FilesFromDir,(string *)psVar4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (regex.field_2._M_local_buf + 8),"/",local_20);
      std::__cxx11::string::operator+=
                ((string *)&this->FilesFromDir,(string *)(regex.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(regex.field_2._M_local_buf + 8));
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&this->FilesFromDir);
    this->Doing = 0;
    break;
  case 4:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,arg);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_90,"/",&local_91);
    std::allocator<char>::~allocator(&local_91);
    cmsys::Glob::PatternToRegex(&local_b8,local_20,false,false);
    std::__cxx11::string::operator+=((string *)local_90,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::operator+=((string *)local_90,"$");
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    local_c8._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    local_c0 = __gnu_cxx::
               __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
               ::operator-(&local_c8,1);
    pMVar5 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator*(&local_c0);
    this->CurrentMatchRule = pMVar5;
    bVar2 = cmsys::RegularExpression::is_valid(&this->CurrentMatchRule->Regex);
    if (bVar2) {
      this->Doing = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
      poVar6 = std::operator<<((ostream *)local_240,"could not compile PATTERN \"");
      poVar6 = std::operator<<(poVar6,(string *)local_20);
      std::operator<<(poVar6,"\".");
      pcVar1 = &this->FileCommand->super_cmCommand;
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(pcVar1,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
    }
    std::__cxx11::string::~string((string *)local_90);
    break;
  case 6:
    std::vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<cmFileCopier::MatchRule,std::allocator<cmFileCopier::MatchRule>> *)
               &this->MatchRules,arg);
    local_270._M_current =
         (MatchRule *)
         std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>::end
                   (&this->MatchRules);
    local_268 = __gnu_cxx::
                __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
                ::operator-(&local_270,1);
    pMVar5 = __gnu_cxx::
             __normal_iterator<cmFileCopier::MatchRule_*,_std::vector<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>_>
             ::operator*(&local_268);
    this->CurrentMatchRule = pMVar5;
    bVar2 = cmsys::RegularExpression::is_valid(&this->CurrentMatchRule->Regex);
    if (bVar2) {
      this->Doing = 0;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_3e8);
      poVar6 = std::operator<<((ostream *)local_3e8,"could not compile REGEX \"");
      poVar6 = std::operator<<(poVar6,(string *)local_20);
      std::operator<<(poVar6,"\".");
      pcVar1 = &this->FileCommand->super_cmCommand;
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(pcVar1,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      this->Doing = 1;
      std::__cxx11::ostringstream::~ostringstream(local_3e8);
    }
    break;
  case 7:
    bVar2 = CheckPermissions(this,arg,&this->FilePermissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  case 8:
    bVar2 = CheckPermissions(this,arg,&this->DirPermissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  case 9:
    bVar2 = CheckPermissions(this,arg,&(this->CurrentMatchRule->Properties).Permissions);
    if (!bVar2) {
      this->Doing = 1;
    }
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckValue(std::string const& arg)
{
  switch (this->Doing) {
    case DoingFiles:
      this->Files.push_back(arg);
      break;
    case DoingDestination:
      if (arg.empty() || cmSystemTools::FileIsFullPath(arg)) {
        this->Destination = arg;
      } else {
        this->Destination = this->Makefile->GetCurrentBinaryDirectory();
        this->Destination += "/" + arg;
      }
      this->Doing = DoingNone;
      break;
    case DoingFilesFromDir:
      if (cmSystemTools::FileIsFullPath(arg)) {
        this->FilesFromDir = arg;
      } else {
        this->FilesFromDir = this->Makefile->GetCurrentSourceDirectory();
        this->FilesFromDir += "/" + arg;
      }
      cmSystemTools::ConvertToUnixSlashes(this->FilesFromDir);
      this->Doing = DoingNone;
      break;
    case DoingPattern: {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      std::string regex = "/";
      regex += cmsys::Glob::PatternToRegex(arg, false);
      regex += "$";
      this->MatchRules.emplace_back(regex);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile PATTERN \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
      }
    } break;
    case DoingRegex:
      this->MatchRules.emplace_back(arg);
      this->CurrentMatchRule = &*(this->MatchRules.end() - 1);
      if (this->CurrentMatchRule->Regex.is_valid()) {
        this->Doing = DoingNone;
      } else {
        std::ostringstream e;
        e << "could not compile REGEX \"" << arg << "\".";
        this->FileCommand->SetError(e.str());
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsFile:
      if (!this->CheckPermissions(arg, this->FilePermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsDir:
      if (!this->CheckPermissions(arg, this->DirPermissions)) {
        this->Doing = DoingError;
      }
      break;
    case DoingPermissionsMatch:
      if (!this->CheckPermissions(
            arg, this->CurrentMatchRule->Properties.Permissions)) {
        this->Doing = DoingError;
      }
      break;
    default:
      return false;
  }
  return true;
}